

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

constraint_order baryonyx::itm::compute_order::next_state(constraint_order current)

{
  constraint_order local_18;
  int_type int_max;
  int_type int_current;
  constraint_order current_local;
  
  local_18 = current + reversing;
  if (7 < (int)local_18) {
    local_18 = none;
  }
  return local_18;
}

Assistant:

static solver_parameters::constraint_order next_state(
      solver_parameters::constraint_order current) noexcept
    {
        using int_type = typename std::underlying_type<
          solver_parameters::constraint_order>::type;

        auto int_current = static_cast<int_type>(current);
        auto int_max =
          static_cast<int_type>(solver_parameters::constraint_order::cycle);

        ++int_current;

        return static_cast<solver_parameters::constraint_order>(
          int_current >= int_max ? 0 : int_current);
    }